

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O1

FT_Error cff_parse_blend(CFF_Parser parser)

{
  FT_UInt vsindex;
  FT_UInt lenNDV;
  void *pvVar1;
  long lVar2;
  FT_Fixed *NDV;
  FT_Byte *block;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  long lVar5;
  undefined1 *puVar6;
  FT_Bool FVar7;
  FT_Error FVar8;
  uint uVar9;
  FT_PtrDist offset;
  FT_Pointer pvVar10;
  FT_Long FVar11;
  uint uVar12;
  FT_Byte **ppFVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  FT_Error error;
  FT_Error local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pvVar1 = parser->object;
  if (pvVar1 == (void *)0x0) {
    return 3;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x2d0);
  if (lVar2 == 0) {
    return 3;
  }
  vsindex = *(FT_UInt *)((long)pvVar1 + 0x2c8);
  lenNDV = *(FT_UInt *)(lVar2 + 0x450);
  NDV = *(FT_Fixed **)(lVar2 + 0x458);
  FVar7 = cff_blend_check_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV);
  if ((FVar7 != '\0') &&
     (FVar8 = cff_blend_build_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV), FVar8 != 0)) {
    return FVar8;
  }
  local_48 = cff_parse_num(parser,parser->top + -1);
  uVar17 = (uint)local_48;
  if (parser->stackSize < uVar17) {
    return 3;
  }
  local_58 = 0;
  uVar9 = *(int *)(lVar2 + 0x440) * uVar17;
  uVar12 = (uint)((ulong)((long)parser->top + (-8 - (long)parser->stack)) >> 3);
  local_50 = (ulong)(uVar12 - uVar9);
  if (uVar12 < uVar9) {
    local_58 = 0xa1;
  }
  else {
    iVar14 = uVar17 * 5;
    uVar9 = *(uint *)(lVar2 + 0x474);
    if (uVar9 < (uint)(*(int *)(lVar2 + 0x470) + iVar14)) {
      block = *(FT_Byte **)(lVar2 + 0x460);
      pFVar3 = *(FT_Byte **)(lVar2 + 0x468);
      pvVar10 = ft_mem_qrealloc(*(FT_Memory *)(*(long *)(lVar2 + 0x428) + 0x10),1,(ulong)uVar9,
                                (ulong)(uVar9 + iVar14),block,&local_58);
      *(FT_Pointer *)(lVar2 + 0x460) = pvVar10;
      if (local_58 != 0) goto LAB_00226a63;
      *(ulong *)(lVar2 + 0x468) = (ulong)*(uint *)(lVar2 + 0x470) + (long)pvVar10;
      *(int *)(lVar2 + 0x474) = *(int *)(lVar2 + 0x474) + iVar14;
      if ((block != (FT_Byte *)0x0) && ((long)pvVar10 - (long)block != 0)) {
        for (ppFVar13 = parser->stack; ppFVar13 < parser->top; ppFVar13 = ppFVar13 + 1) {
          pFVar4 = *ppFVar13;
          if ((block <= pFVar4) && (pFVar4 < pFVar3)) {
            *ppFVar13 = pFVar4 + ((long)pvVar10 - (long)block);
          }
        }
      }
    }
    *(int *)(lVar2 + 0x470) = *(int *)(lVar2 + 0x470) + iVar14;
    uVar9 = (int)local_50 + uVar17;
    local_54 = uVar9;
    if (uVar17 != 0) {
      local_48 = local_48 & 0xffffffff;
      local_38 = 0;
      do {
        lVar5 = *(long *)(lVar2 + 0x448);
        local_40 = (ulong)(uint)((int)local_50 + (int)local_38);
        FVar11 = cff_parse_num(parser,parser->stack + local_40);
        iVar14 = (int)FVar11 << 0x10;
        if (1 < *(uint *)(lVar2 + 0x440)) {
          lVar16 = 1;
          do {
            uVar15 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
            FVar11 = cff_parse_num(parser,parser->stack + uVar15);
            iVar14 = iVar14 + (int)FVar11 * *(int *)(lVar5 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while ((uint)lVar16 < *(uint *)(lVar2 + 0x440));
        }
        parser->stack[local_40] = *(FT_Byte **)(lVar2 + 0x468);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = 0xff;
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar14 >> 0x18);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar14 >> 0x10);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar14 >> 8);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)iVar14;
        local_38 = local_38 + 1;
      } while (local_38 != local_48);
    }
    parser->top = parser->stack + local_54;
  }
LAB_00226a63:
  *(undefined1 *)(lVar2 + 0x421) = 1;
  return local_58;
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }